

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * uprv_decNumberLogB_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint32_t status;
  uint32_t local_1c;
  
  local_1c = 0;
  if ((rhs->bits & 0x30) == 0) {
    if ((rhs->bits & 0x40) != 0) {
      uprv_decNumberCopyAbs_63(res,rhs);
      return res;
    }
    if (rhs->digits != 1 || rhs->lsu[0] != '\0') {
      uprv_decNumberFromInt32_63(res,rhs->exponent + rhs->digits + -1);
      return res;
    }
    res->digits = 1;
    res->exponent = 0;
    res->bits = 0xc0;
    res->lsu[0] = '\0';
    status = 2;
  }
  else {
    decNaNs(res,rhs,(decNumber *)0x0,set,&local_1c);
    status = local_1c;
    if (local_1c == 0) {
      return res;
    }
  }
  decStatus(res,status,set);
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberLogB(decNumber *res, const decNumber *rhs,
                          decContext *set) {
  uInt status=0;                   /* accumulator  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* NaNs as usual; Infinities return +Infinity; 0->oops  */
  if (decNumberIsNaN(rhs)) decNaNs(res, rhs, NULL, set, &status);
   else if (decNumberIsInfinite(rhs)) uprv_decNumberCopyAbs(res, rhs);
   else if (decNumberIsZero(rhs)) {
    uprv_decNumberZero(res);                 /* prepare for Infinity  */
    res->bits=DECNEG|DECINF;            /* -Infinity  */
    status|=DEC_Division_by_zero;       /* as per 754  */
    }
   else { /* finite non-zero  */
    Int ae=rhs->exponent+rhs->digits-1; /* adjusted exponent  */
    uprv_decNumberFromInt32(res, ae);        /* lay it out  */
    }

  if (status!=0) decStatus(res, status, set);
  return res;
  }